

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O2

void __thiscall cfdcapi_coin_EstimateFeeTest_Test::TestBody(cfdcapi_coin_EstimateFeeTest_Test *this)

{
  void *fee_handle_00;
  void *handle_00;
  long lVar1;
  pointer pUVar2;
  char *pcVar3;
  Script *locking_script;
  Amount AVar4;
  initializer_list<cfd::UtxoData> __l;
  allocator_type local_1545;
  allocator local_1544;
  allocator local_1543;
  allocator local_1542;
  allocator local_1541;
  allocator local_1540;
  allocator local_153f;
  allocator local_153e;
  allocator local_153d;
  allocator local_153c;
  allocator local_153b;
  allocator local_153a;
  allocator local_1539;
  Script local_1538;
  Script local_1500;
  pointer local_14c8;
  int ret;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount local_1470;
  Amount local_1460;
  string local_1450;
  string local_1430;
  string local_1410;
  string local_13f0;
  string local_13d0;
  Txid local_13b0;
  string local_1390;
  BlockHash local_1370;
  string local_1350;
  string local_1330;
  string local_1310;
  string local_12f0;
  string local_12d0;
  Txid local_12b0;
  string local_1290;
  BlockHash local_1270;
  AddressFactory factory;
  ConfidentialAssetId local_1228;
  BlindFactor local_1200;
  BlindFactor local_11e0;
  BlindFactor local_11c0;
  BlindFactor local_11a0;
  int64_t tx_fee;
  int64_t utxo_fee;
  ConfidentialValue local_e90;
  ConfidentialValue local_e68;
  ConfidentialAssetId local_e40;
  Script local_e18;
  Script local_de0;
  Script local_da8;
  void *fee_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d68 [53];
  AssertionResult gtest_ar;
  UtxoData local_6d0;
  void *handle;
  
  cfd::AddressFactory::AddressFactory(&factory);
  std::__cxx11::string::string
            ((string *)&local_1290,
             "590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4",&local_1539);
  cfd::core::BlockHash::BlockHash(&local_1270,&local_1290);
  std::__cxx11::string::string
            ((string *)&local_12d0,
             "ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318",&local_153a);
  cfd::core::Txid::Txid(&local_12b0,&local_12d0);
  std::__cxx11::string::string
            ((string *)&local_12f0,"a914155801788fcd51f57e097a0b6c30f1b69057290d87",&local_153b);
  cfd::core::Script::Script(&local_1538,&local_12f0);
  std::__cxx11::string::string
            ((string *)&local_1310,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd",&local_153c);
  cfd::core::Script::Script(&local_1500,&local_1310);
  std::__cxx11::string::string
            ((string *)&local_1330,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k",&local_153d);
  cfd::AddressFactory::GetAddress((Address *)&tx_fee,&factory,&local_1330);
  std::__cxx11::string::string
            ((string *)&local_1350,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,&local_153e);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(600000000);
  local_1460.amount_ = AVar4.amount_;
  local_1460.ignore_check_ = AVar4.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_e40);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  cfd::core::BlindFactor::BlindFactor(&local_11a0);
  cfd::core::BlindFactor::BlindFactor(&local_11c0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_e68);
  cfd::core::Script::Script((Script *)&ret);
  cfd::UtxoData::UtxoData
            ((UtxoData *)&gtest_ar,0xc,&local_1270,&local_12b0,0,&local_1538,&local_1500,
             (Address *)&tx_fee,&local_1350,&local_1460,0,(void *)0x0,&local_e40,
             (ElementsConfidentialAddress *)&fee_handle,&local_11a0,&local_11c0,&local_e68,
             (Script *)&ret);
  std::__cxx11::string::string
            ((string *)&local_1390,
             "e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996",&local_153f);
  cfd::core::BlockHash::BlockHash(&local_1370,&local_1390);
  std::__cxx11::string::string
            ((string *)&local_13d0,
             "d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79",&local_1540);
  cfd::core::Txid::Txid(&local_13b0,&local_13d0);
  std::__cxx11::string::string
            ((string *)&local_13f0,"a914155801788fcd51f57e097a0b6c30f1b69057290d87",&local_1541);
  cfd::core::Script::Script(&local_de0,&local_13f0);
  std::__cxx11::string::string
            ((string *)&local_1410,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd",&local_1542);
  cfd::core::Script::Script(&local_e18,&local_1410);
  std::__cxx11::string::string
            ((string *)&local_1430,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k",&local_1543);
  cfd::AddressFactory::GetAddress((Address *)&utxo_fee,&factory,&local_1430);
  std::__cxx11::string::string
            ((string *)&local_1450,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,&local_1544);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(700000000);
  local_1470.amount_ = AVar4.amount_;
  local_1470.ignore_check_ = AVar4.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1228);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&handle);
  cfd::core::BlindFactor::BlindFactor(&local_11e0);
  cfd::core::BlindFactor::BlindFactor(&local_1200);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_e90);
  cfd::core::Script::Script(&local_da8);
  locking_script = &local_de0;
  cfd::UtxoData::UtxoData
            (&local_6d0,0x16,&local_1370,&local_13b0,0,locking_script,&local_e18,
             (Address *)&utxo_fee,&local_1450,&local_1470,0,(void *)0x0,&local_1228,
             (ElementsConfidentialAddress *)&handle,&local_11e0,&local_1200,&local_e90,&local_da8);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector(&utxos,__l,&local_1545);
  lVar1 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x4f0;
  } while (lVar1 != -0x4f0);
  cfd::core::Script::~Script(&local_da8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_e90);
  cfd::core::BlindFactor::~BlindFactor(&local_1200);
  cfd::core::BlindFactor::~BlindFactor(&local_11e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&handle);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_1228);
  std::__cxx11::string::~string((string *)&local_1450);
  cfd::core::Address::~Address((Address *)&utxo_fee);
  std::__cxx11::string::~string((string *)&local_1430);
  cfd::core::Script::~Script(&local_e18);
  std::__cxx11::string::~string((string *)&local_1410);
  cfd::core::Script::~Script(&local_de0);
  std::__cxx11::string::~string((string *)&local_13f0);
  cfd::core::Txid::~Txid(&local_13b0);
  std::__cxx11::string::~string((string *)&local_13d0);
  cfd::core::BlockHash::~BlockHash(&local_1370);
  std::__cxx11::string::~string((string *)&local_1390);
  cfd::core::Script::~Script((Script *)&ret);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_e68);
  cfd::core::BlindFactor::~BlindFactor(&local_11c0);
  cfd::core::BlindFactor::~BlindFactor(&local_11a0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_e40);
  std::__cxx11::string::~string((string *)&local_1350);
  cfd::core::Address::~Address((Address *)&tx_fee);
  std::__cxx11::string::~string((string *)&local_1330);
  cfd::core::Script::~Script(&local_1500);
  std::__cxx11::string::~string((string *)&local_1310);
  cfd::core::Script::~Script(&local_1538);
  std::__cxx11::string::~string((string *)&local_12f0);
  cfd::core::Txid::~Txid(&local_12b0);
  std::__cxx11::string::~string((string *)&local_12d0);
  cfd::core::BlockHash::~BlockHash(&local_1270);
  std::__cxx11::string::~string((string *)&local_1290);
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  fee_handle = (void *)((ulong)fee_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&fee_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&fee_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_fee,(Message *)&fee_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&fee_handle);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d68[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  fee_handle = (void *)CONCAT71(fee_handle._1_7_,handle != (void *)0x0);
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_fee);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&fee_handle,(AssertionResult *)"(NULL == handle)",
               "true","false",(char *)locking_script);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x75,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_d68);
  fee_handle = (void *)0x0;
  ret = CfdInitializeEstimateFee(handle,&fee_handle,false);
  tx_fee = (ulong)tx_fee._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (ret == 0) {
    local_14c8 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    for (pUVar2 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                  super__Vector_impl_data._M_start; handle_00 = handle, fee_handle_00 = fee_handle,
        pUVar2 != local_14c8; pUVar2 = pUVar2 + 1) {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,&pUVar2->txid);
      ret = CfdAddTxInForEstimateFee
                      (handle_00,fee_handle_00,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                       pUVar2->vout,(pUVar2->descriptor)._M_dataplus._M_p,(char *)0x0,false,false,
                       false,0,(char *)0x0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      tx_fee = tx_fee & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx_fee);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&utxo_fee,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x85,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&tx_fee);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    ret = CfdFinalizeEstimateFee
                    (handle,fee_handle,
                     "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000"
                     ,(char *)0x0,&tx_fee,&utxo_fee,true,20.0);
    local_1538._vptr_Script = (_func_int **)((ulong)local_1538._vptr_Script._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_1538,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1538);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_1538._vptr_Script = (_func_int **)0xb04;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(2820)","tx_fee",(long *)&local_1538,
               &tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1538);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_1538._vptr_Script = (_func_int **)0xe4c;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(3660)","utxo_fee",(long *)&local_1538,
               &utxo_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1538);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    ret = CfdFreeEstimateFeeHandle(handle,fee_handle);
    local_1538._vptr_Script = (_func_int **)((ulong)local_1538._vptr_Script & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_1538,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x90,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1538);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    tx_fee = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&tx_fee);
    utxo_fee._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&utxo_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1538,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1538);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_fee);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pcVar3 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x98,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1538,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1538);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_fee);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer((char *)tx_fee);
  }
  ret = CfdFreeHandle(handle);
  tx_fee = tx_fee & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeTest) {

  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      static_cast<uint32_t>(12),
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318"),
      static_cast<uint32_t>(0),
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(600000000),
      static_cast<AddressType>(0),
      nullptr,
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    },
    UtxoData{
      22,
      BlockHash("e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996"),
      Txid("d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79"),
      0,
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(700000000),
      static_cast<AddressType>(0),
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, 0, nullptr);
      //ret = CfdAddTxInputForEstimateFee(
      //    handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
      //    utxo.descriptor.c_str(), nullptr,
      //    false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 20.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(2820), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(3660), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}